

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O2

void __thiscall StringValueAnalyser::~StringValueAnalyser(StringValueAnalyser *this)

{
  ~StringValueAnalyser(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

StringValueAnalyser(): valid_(false), value_() {}